

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUCache.hpp
# Opt level: O0

node * __thiscall
sjtu::
LRUCache<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
::load(LRUCache<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
       *this,locType *offset)

{
  bool bVar1;
  CacheNode *pCVar2;
  Node *pNVar3;
  value_type *pvVar4;
  map<long,_sjtu::LRUCache<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>::CacheNode_*,_std::less<long>_>
  *in_RDI;
  CacheNode *tmp;
  CacheNode *node;
  iterator it;
  map<long,_sjtu::LRUCache<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>::CacheNode_*,_std::less<long>_>
  *in_stack_fffffffffffff638;
  Node *pNVar5;
  long *in_stack_fffffffffffff640;
  locType *in_stack_fffffffffffff658;
  LRUCache<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
  *in_stack_fffffffffffff660;
  LRUCache<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
  *in_stack_fffffffffffff678;
  locType *in_stack_fffffffffffff680;
  node *in_stack_fffffffffffff688;
  CacheNode *in_stack_fffffffffffff690;
  iterator local_38;
  CacheNode *local_28;
  iterator local_20 [2];
  
  *(int *)&in_RDI->field_0x10 = *(int *)&in_RDI->field_0x10 + 1;
  map<long,_sjtu::LRUCache<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>::CacheNode_*,_std::less<long>_>
  ::find(in_RDI,in_stack_fffffffffffff640);
  map<long,_sjtu::LRUCache<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>::CacheNode_*,_std::less<long>_>
  ::end(in_stack_fffffffffffff638);
  bVar1 = map<long,_sjtu::LRUCache<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>::CacheNode_*,_std::less<long>_>
          ::iterator::operator==(local_20,&local_38);
  if (bVar1) {
    *(int *)&in_RDI->field_0x14 = *(int *)&in_RDI->field_0x14 + 1;
    pCVar2 = (CacheNode *)operator_new(0x988);
    f_read(in_stack_fffffffffffff660,in_stack_fffffffffffff658);
    CacheNode::CacheNode
              (in_stack_fffffffffffff690,in_stack_fffffffffffff688,in_stack_fffffffffffff680,
               in_stack_fffffffffffff678);
    pNVar5 = in_RDI->nodebegin;
    local_28 = pCVar2;
    pNVar3 = (Node *)map<long,_sjtu::LRUCache<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>::CacheNode_*,_std::less<long>_>
                     ::size((map<long,_sjtu::LRUCache<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>::CacheNode_*,_std::less<long>_>
                             *)&in_RDI[1].nodebegin);
    if (pNVar5 == pNVar3) {
      pNVar5 = in_RDI[1].nil;
      pNVar3 = in_RDI[1].nil[0x3c].left;
      in_RDI[1].nil = pNVar3;
      if (pNVar3 == (Node *)0x0) {
        in_RDI->tot = 0;
      }
      else {
        in_RDI[1].nil[0x3c].right = (Node *)0x0;
      }
      if (pNVar5 != (Node *)0x0) {
        CacheNode::~CacheNode(pCVar2);
        operator_delete(pNVar5,0x988);
      }
    }
    if (in_RDI->tot == 0) {
      in_RDI[1].nil = (Node *)local_28;
      in_RDI->tot = (size_t)local_28;
    }
    else {
      pCVar2 = (CacheNode *)in_RDI->tot;
      local_28->succ = pCVar2;
      pCVar2->prec = local_28;
      in_RDI->tot = (size_t)local_28;
    }
  }
  else {
    pvVar4 = map<long,_sjtu::LRUCache<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>::CacheNode_*,_std::less<long>_>
             ::iterator::operator->(local_20);
    local_28 = pvVar4->second;
    if (local_28 != (CacheNode *)in_RDI->tot) {
      local_28->prec->succ = local_28->succ;
      if (local_28->succ == (CacheNode *)0x0) {
        in_RDI[1].nil = (Node *)local_28->prec;
      }
      else {
        local_28->succ->prec = local_28->prec;
      }
      local_28->prec = (CacheNode *)0x0;
      pCVar2 = (CacheNode *)in_RDI->tot;
      local_28->succ = pCVar2;
      pCVar2->prec = local_28;
      in_RDI->tot = (size_t)local_28;
    }
  }
  return &local_28->value;
}

Assistant:

valueType *load(const locType &offset)
		{
			++ attempt_count;
			typename map<locType , CacheNode*>::iterator it = table.find(offset);
			CacheNode *node;
			if (it == table.end())
			{
				++ miss_count;
				node = new CacheNode (f_read(offset) , offset , this);
				if (block_lim == table.size())
				{
					CacheNode *tmp = tail;
					if (tail = tail -> prec) tail -> succ = nullptr;
					else  head = nullptr;
					delete tmp;
				}
				if (head == nullptr) head = tail = node;
				else (node -> succ = head) -> prec = node , head = node;
			}
			else
			{
				node = it -> second;
				if (node != head)
				{
					node -> prec -> succ = node -> succ;
					if (node -> succ) node -> succ -> prec = node -> prec;
					else tail = node -> prec;
					node -> prec = nullptr , (node -> succ = head) -> prec = node , head = node;
				}
			}
			return &(node -> value);
		}